

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall Renderer::writeImg(Renderer *this,uint32_t iteration)

{
  ushort uVar1;
  ushort uVar2;
  PFNGLREADPIXELSPROC p_Var3;
  uint uVar4;
  uint y;
  size_type __n;
  uchar *puVar5;
  char *filename;
  int local_c4;
  string local_c0;
  allocator<char> local_99;
  undefined1 local_98 [8];
  string path;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  GLsizei bufferSize;
  GLsizei stride;
  GLsizei nbChannels;
  uint32_t iteration_local;
  Renderer *this_local;
  
  uVar4 = (uint)Config::width * 3;
  if (uVar4 % 4 == 0) {
    local_c4 = 0;
  }
  else {
    local_c4 = 4 - uVar4 % 4;
  }
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = uVar4 + local_c4;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ * (uint)Config::height;
  __n = (size_type)
        (int)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,__n,&local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  (*glad_glPixelStorei)(0xd05,4);
  (*glad_glReadBuffer)(0x404);
  p_Var3 = glad_glReadPixels;
  uVar2 = Config::height;
  uVar1 = Config::width;
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  (*p_Var3)(0,0,(GLsizei)uVar1,(GLsizei)uVar2,0x1907,0x1401,puVar5);
  stbi_flip_vertically_on_write(1);
  std::filesystem::__cxx11::path::path<char[14],std::filesystem::__cxx11::path>
            ((path *)((long)&path.field_2 + 8),(char (*) [14])"result-frames",auto_format);
  std::filesystem::create_directory((path *)((long)&path.field_2 + 8));
  std::filesystem::__cxx11::path::~path((path *)((long)&path.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"result-frames/",&local_99);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::to_string(&local_c0,iteration);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,&local_c0
            );
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,".png");
  filename = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_98);
  uVar4 = (uint)Config::width;
  y = (uint)Config::height;
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  stbi_write_png(filename,uVar4,y,3,puVar5,
                 buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
  std::__cxx11::string::~string((string *)local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void Renderer::writeImg(const std::uint32_t iteration) const
{
    GLsizei nbChannels = 3;
    GLsizei stride = nbChannels * Config::width;
    stride += (stride % 4) ? (4 - stride % 4) : 0;
    GLsizei bufferSize = stride * Config::height;
    std::vector<std::uint8_t> buffer(bufferSize);
    glPixelStorei(GL_PACK_ALIGNMENT, 4);
    glReadBuffer(GL_FRONT);
    glReadPixels(0, 0, Config::width, Config::height,
            GL_RGB, GL_UNSIGNED_BYTE, buffer.data());
    stbi_flip_vertically_on_write(true);
    std::filesystem::create_directory("result-frames");
    std::string path = "result-frames/";
    path += std::to_string(iteration);
    path += ".png";
    stbi_write_png(path.c_str(), Config::width, Config::height,
            nbChannels, buffer.data(), stride);
}